

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O0

int64_t yactfr::internal::anon_unknown_0::readFlSIntLe50At6(uint8_t *buf)

{
  ulong local_18;
  uint64_t res;
  uint8_t *buf_local;
  
  local_18 = (long)((int)(uint)*buf >> 6) | (ulong)*(uint6 *)(buf + 1) << 2;
  if (((ulong)*(uint6 *)(buf + 1) << 2) >> 0x31 != 0) {
    local_18 = local_18 | 0xfffc000000000000;
  }
  return local_18;
}

Assistant:

std::int64_t readFlSIntLe50At6(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[6];
    res <<= 8;
    res |= buf[5];
    res <<= 8;
    res |= buf[4];
    res <<= 8;
    res |= buf[3];
    res <<= 8;
    res |= buf[2];
    res <<= 8;
    res |= buf[1];
    res <<= 2;
    res |= (buf[0] >> 6);
    res &= UINT64_C(0x3ffffffffffff);

    if (res >> 49) {
        res |= UINT64_C(0xfffc000000000000);
    }

    return static_cast<std::int64_t>(res);
}